

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  cmSourceFile *this_00;
  pointer ppcVar1;
  bool bVar2;
  string *psVar3;
  pointer ppcVar4;
  cmExtraSublimeTextGenerator *this_01;
  iterator iVar5;
  ostream *poVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar7;
  string flagsString;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  string definesString;
  string workString;
  string includesString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string makefileName;
  char *local_160;
  char *local_60;
  
  if (target != (cmGeneratorTarget *)0x0) {
    sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&makefileName,"CMAKE_BUILD_TYPE",(allocator<char> *)&flagsString);
    psVar3 = cmMakefile::GetSafeDefinition(makefile,&makefileName);
    cmGeneratorTarget::GetSourceFiles(target,&sourceFiles,psVar3);
    std::__cxx11::string::~string((string *)&makefileName);
    ppcVar1 = sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar4 = sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
        ppcVar4 = ppcVar4 + 1) {
      this_00 = *ppcVar4;
      this_01 = (cmExtraSublimeTextGenerator *)
                cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::find(&sourceFileFlags->_M_t,(key_type *)this_01);
      if ((_Rb_tree_header *)iVar5._M_node == &(sourceFileFlags->_M_t)._M_impl.super__Rb_tree_header
         ) {
        psVar3 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
        flagsString._M_dataplus._M_p = (pointer)0x0;
        flagsString._M_string_length = 0;
        flagsString.field_2._M_allocated_capacity = 0;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::
        pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&makefileName,psVar3,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&flagsString);
        this_01 = (cmExtraSublimeTextGenerator *)&makefileName;
        pVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                            *)sourceFileFlags,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&makefileName);
        iVar5._M_node = (_Base_ptr)pVar7.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&makefileName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&flagsString);
      }
      ComputeFlagsForObject_abi_cxx11_(&flagsString,this_01,this_00,lg,target);
      ComputeDefines_abi_cxx11_(&definesString,this_01,this_00,lg,target);
      ComputeIncludes_abi_cxx11_(&includesString,this_01,this_00,lg,target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(iVar5._M_node + 2));
      memset((RegularExpression *)&makefileName,0,0x20a);
      cmsys::RegularExpression::compile
                ((RegularExpression *)&makefileName,
                 "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
      cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&workString,&flagsString,(char (*) [2])0x71487c,&definesString,
                 (char (*) [2])0x71487c,&includesString);
      while (bVar2 = cmsys::RegularExpression::find
                               ((RegularExpression *)&makefileName,workString._M_dataplus._M_p),
            bVar2) {
        std::__cxx11::string::substr((ulong)&local_280,(ulong)&workString);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (iVar5._M_node + 2),&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        if ((ulong)((long)local_160 - (long)local_60) < workString._M_string_length) {
          std::__cxx11::string::substr((ulong)&local_280,(ulong)&workString);
          std::__cxx11::string::operator=((string *)&workString,(string *)&local_280);
          std::__cxx11::string::~string((string *)&local_280);
        }
        else {
          workString._M_string_length = 0;
          *workString._M_dataplus._M_p = '\0';
        }
      }
      std::__cxx11::string::~string((string *)&workString);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&makefileName);
      std::__cxx11::string::~string((string *)&includesString);
      std::__cxx11::string::~string((string *)&definesString);
      std::__cxx11::string::~string((string *)&flagsString);
    }
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  }
  makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
  makefileName._M_string_length = 0;
  makefileName.field_2._M_local_buf[0] = '\0';
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&flagsString);
  std::operator==(&flagsString,"Ninja");
  std::__cxx11::string::~string((string *)&flagsString);
  std::__cxx11::string::assign((char *)&makefileName);
  if (!firstTarget) {
    std::operator<<((ostream *)fout,",\n\t");
  }
  poVar6 = std::operator<<((ostream *)fout,"\t{\n\t\t\t\"name\": \"");
  cmLocalGenerator::GetProjectName_abi_cxx11_(&flagsString,lg);
  poVar6 = std::operator<<(poVar6,(string *)&flagsString);
  poVar6 = std::operator<<(poVar6," - ");
  poVar6 = std::operator<<(poVar6,(string *)targetName);
  std::operator<<(poVar6,"\",\n");
  std::__cxx11::string::~string((string *)&flagsString);
  poVar6 = std::operator<<((ostream *)fout,"\t\t\t\"cmd\": [");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&definesString,make,(allocator<char> *)&includesString);
  BuildMakeCommand(&flagsString,this,&definesString,&makefileName,targetName);
  poVar6 = std::operator<<(poVar6,(string *)&flagsString);
  std::operator<<(poVar6,"],\n");
  std::__cxx11::string::~string((string *)&flagsString);
  std::__cxx11::string::~string((string *)&definesString);
  std::operator<<((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n");
  std::operator<<((ostream *)fout,
                  "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
                 );
  std::operator<<((ostream *)fout,"\t\t}");
  std::__cxx11::string::~string((string *)&makefileName);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != nullptr) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    for (cmSourceFile* sourceFile : sourceFiles) {
      auto sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->ResolveFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(
              sourceFile->ResolveFullPath(), std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString =
        this->ComputeFlagsForObject(sourceFile, lg, target);
      std::string definesString = this->ComputeDefines(sourceFile, lg, target);
      std::string includesString =
        this->ComputeIncludes(sourceFile, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        R"((^|[ ])-[DIOUWfgs][^= ]+(=\"[^"]+\"|=[^"][^ ]+)?)";
      flagRegex.compile(regexString);
      std::string workString =
        cmStrCat(flagsString, " ", definesString, " ", includesString);
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString.clear();
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName, targetName) << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}